

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doInspection(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  longlong i;
  Pipeline *pPVar5;
  element_type *peVar6;
  ulong uVar7;
  vector<QPDFExc,_std::allocator<QPDFExc>_> local_d8;
  allocator<char> local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [32];
  QPDFObjectHandle local_40;
  QPDFLogger local_30;
  element_type *local_20;
  element_type *cout;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  cout = (element_type *)pdf;
  pdf_local = (QPDF *)this;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar2);
  QPDFLogger::getInfo(&local_30,SUB81(peVar3,0));
  peVar4 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_30);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_30);
  local_20 = peVar4;
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->check & 1U) != 0) {
    doCheck(this,(QPDF *)cout);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->show_npages & 1U) != 0) {
    QTC::TC("qpdf","QPDFJob npages",0);
    peVar4 = local_20;
    QPDF::getRoot((QPDF *)local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"/Pages",&local_81);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_60 + 0x10),(string *)local_60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"/Count",&local_b9);
    QPDFObjectHandle::getKey(&local_40,(string *)(local_60 + 0x10));
    i = QPDFObjectHandle::getIntValue(&local_40);
    pPVar5 = Pipeline::operator<<(peVar4,i);
    Pipeline::operator<<(pPVar5,"\n");
    QPDFObjectHandle::~QPDFObjectHandle(&local_40);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_60 + 0x10));
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_60);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->show_encryption & 1U) != 0) {
    showEncryption(this,(QPDF *)cout);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->check_linearization & 1U) != 0) {
    bVar1 = QPDF::isLinearized((QPDF *)cout);
    peVar4 = local_20;
    if (bVar1) {
      bVar1 = QPDF::checkLinearization((QPDF *)cout);
      peVar4 = local_20;
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(peVar2->infilename).
                             super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>);
        pPVar5 = Pipeline::operator<<(peVar4,peVar6);
        Pipeline::operator<<(pPVar5,": no linearization errors\n");
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        peVar2->warnings = true;
      }
    }
    else {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(peVar2->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>
                         );
      pPVar5 = Pipeline::operator<<(peVar4,peVar6);
      Pipeline::operator<<(pPVar5," is not linearized\n");
    }
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->show_linearization & 1U) != 0) {
    bVar1 = QPDF::isLinearized((QPDF *)cout);
    peVar4 = local_20;
    if (bVar1) {
      QPDF::showLinearizationData((QPDF *)cout);
    }
    else {
      peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(peVar2->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>
                         );
      pPVar5 = Pipeline::operator<<(peVar4,peVar6);
      Pipeline::operator<<(pPVar5," is not linearized\n");
    }
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->show_xref & 1U) != 0) {
    QPDF::showXRefTable((QPDF *)cout);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((0 < peVar2->show_obj) ||
     (peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this), (peVar2->show_trailer & 1U) != 0)) {
    doShowObj(this,(QPDF *)cout);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->show_pages & 1U) != 0) {
    doShowPages(this,(QPDF *)cout);
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->list_attachments & 1U) != 0) {
    doListAttachments(this,(QPDF *)cout);
  }
  std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
            );
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    doShowAttachment(this,(QPDF *)cout);
  }
  QPDF::getWarnings(&local_d8,(QPDF *)cout);
  bVar1 = std::vector<QPDFExc,_std::allocator<QPDFExc>_>::empty(&local_d8);
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::~vector(&local_d8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar2->warnings = true;
  }
  return;
}

Assistant:

void
QPDFJob::doInspection(QPDF& pdf)
{
    auto& cout = *m->log->getInfo();
    if (m->check) {
        doCheck(pdf);
    }
    if (m->show_npages) {
        QTC::TC("qpdf", "QPDFJob npages");
        cout << pdf.getRoot().getKey("/Pages").getKey("/Count").getIntValue() << "\n";
    }
    if (m->show_encryption) {
        showEncryption(pdf);
    }
    if (m->check_linearization) {
        if (!pdf.isLinearized()) {
            cout << m->infilename.get() << " is not linearized\n";
        } else if (pdf.checkLinearization()) {
            cout << m->infilename.get() << ": no linearization errors\n";
        } else {
            m->warnings = true;
        }
    }
    if (m->show_linearization) {
        if (pdf.isLinearized()) {
            pdf.showLinearizationData();
        } else {
            cout << m->infilename.get() << " is not linearized\n";
        }
    }
    if (m->show_xref) {
        pdf.showXRefTable();
    }
    if ((m->show_obj > 0) || m->show_trailer) {
        doShowObj(pdf);
    }
    if (m->show_pages) {
        doShowPages(pdf);
    }
    if (m->list_attachments) {
        doListAttachments(pdf);
    }
    if (!m->attachment_to_show.empty()) {
        doShowAttachment(pdf);
    }
    if (!pdf.getWarnings().empty()) {
        m->warnings = true;
    }
}